

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

pair<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_bool>
* __thiscall
pstore::json::details::array_matcher<(anonymous_namespace)::yaml_output>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_bool>
           *__return_storage_ptr__,array_matcher<(anonymous_namespace)::yaml_output> *this,
          parser<(anonymous_namespace)::yaml_output> *parser,maybe<char,_void> *ch)

{
  byte bVar1;
  int iVar2;
  _Head_base<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_false>
  _Var3;
  bool bVar4;
  byte *pbVar5;
  error_code local_30;
  
  if (ch->valid_ == false) {
LAB_00108db7:
    local_30._M_cat = get_error_category();
    local_30._M_value = 1;
    matcher<(anonymous_namespace)::yaml_output>::set_error
              (&this->super_matcher<(anonymous_namespace)::yaml_output>,parser,&local_30);
LAB_00108dd6:
    *(undefined8 *)
     &(__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
         = 1;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
    .
    super__Head_base<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_false>
    ._M_head_impl = (matcher<(anonymous_namespace)::yaml_output> *)0x0;
LAB_00108de2:
    bVar4 = true;
  }
  else {
    pbVar5 = (byte *)maybe<char,_void>::operator->(ch);
    iVar2 = (this->super_matcher<(anonymous_namespace)::yaml_output>).state_;
    if (4 < iVar2 - 1U) goto LAB_00108dd6;
    bVar1 = *pbVar5;
    switch(iVar2) {
    case 1:
      assert_failed("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x4c6);
    case 2:
      if (bVar1 != 0x5b) {
        assert_failed("c == \'[\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x4a3);
      }
      local_30._0_8_ = 0;
      std::
      deque<std::shared_ptr<pstore::dump::value>,std::allocator<std::shared_ptr<pstore::dump::value>>>
      ::emplace_back<decltype(nullptr)>
                ((deque<std::shared_ptr<pstore::dump::value>,std::allocator<std::shared_ptr<pstore::dump::value>>>
                  *)&parser->callbacks_,(void **)&local_30);
      local_30._M_cat = (error_category *)std::_V2::system_category();
      local_30._0_8_ = local_30._0_8_ & 0xffffffff00000000;
      bVar4 = matcher<(anonymous_namespace)::yaml_output>::set_error
                        (&this->super_matcher<(anonymous_namespace)::yaml_output>,parser,&local_30);
      if (bVar4) goto LAB_00108dd6;
      (this->super_matcher<(anonymous_namespace)::yaml_output>).state_ = 3;
LAB_00108d83:
      _Var3._M_head_impl =
           (parser->singletons_)._M_t.
           super___uniq_ptr_impl<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
           .
           super__Head_base<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_false>
           ._M_head_impl;
      *(undefined4 *)((long)&(_Var3._M_head_impl)->terminal + 8) = 2;
      ((_Var3._M_head_impl)->terminal).__align =
           (anon_struct_8_0_00000001_for___align)&PTR__matcher_00116c78;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      .
      super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      .
      super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>,_false>
           = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>,_false>
              )0x0;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      .
      super__Head_base<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_false>
      ._M_head_impl = (matcher<(anonymous_namespace)::yaml_output> *)&(_Var3._M_head_impl)->terminal
      ;
      goto LAB_00108de2;
    case 3:
      if (bVar1 == 0x5d) goto LAB_00108daa;
    case 4:
      (this->super_matcher<(anonymous_namespace)::yaml_output>).state_ = 5;
      _Var3._M_head_impl =
           (parser->singletons_)._M_t.
           super___uniq_ptr_impl<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
           .
           super__Head_base<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_false>
           ._M_head_impl;
      *(undefined4 *)((long)&(_Var3._M_head_impl)->root + 8) = 2;
      ((_Var3._M_head_impl)->root).__align =
           (anon_struct_8_0_00000001_for___align)&PTR__matcher_00116cb8;
      bVar4 = false;
      *(undefined1 *)((long)&(_Var3._M_head_impl)->root + 0xc) = 0;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      .
      super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      .
      super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>,_false>
           = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>,_false>
              )0x0;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
      .
      super__Head_base<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_false>
      ._M_head_impl = (matcher<(anonymous_namespace)::yaml_output> *)&(_Var3._M_head_impl)->root;
      break;
    case 5:
      if (bVar1 < 0x2d) {
        if ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0) {
          _Var3._M_head_impl =
               (parser->singletons_)._M_t.
               super___uniq_ptr_impl<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
               .
               super__Head_base<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_false>
               ._M_head_impl;
          *(undefined4 *)((long)&(_Var3._M_head_impl)->terminal + 8) = 2;
          ((_Var3._M_head_impl)->terminal).__align =
               (anon_struct_8_0_00000001_for___align)&PTR__matcher_00116c78;
          (__return_storage_ptr__->first)._M_t.
          super___uniq_ptr_impl<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
          .
          super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
          .
          super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>,_false>
               = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>,_false>
                  )0x0;
          (__return_storage_ptr__->first)._M_t.
          super___uniq_ptr_impl<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
          .
          super__Head_base<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_false>
          ._M_head_impl =
               (matcher<(anonymous_namespace)::yaml_output> *)&(_Var3._M_head_impl)->terminal;
          bVar4 = false;
          break;
        }
        if ((ulong)bVar1 == 0x2c) {
          (this->super_matcher<(anonymous_namespace)::yaml_output>).state_ =
               ((parser->extensions_ & array_trailing_comma) == none) + 3;
          goto LAB_00108d83;
        }
      }
      if (bVar1 != 0x5d) goto LAB_00108db7;
LAB_00108daa:
      end_array(this,parser);
      goto LAB_00108dd6;
    }
  }
  __return_storage_ptr__->second = bVar4;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            array_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> ch) {
                if (!ch) {
                    this->set_error (parser, error_code::expected_array_member);
                    return {nullptr, true};
                }
                char const c = *ch;
                switch (this->get_state ()) {
                case start_state:
                    PSTORE_ASSERT (c == '[');
                    if (this->set_error (parser, parser.callbacks ().begin_array ())) {
                        break;
                    }
                    this->set_state (first_object_state);
                    // Match this character and consume whitespace before the object (or close
                    // bracket).
                    return {this->make_whitespace_matcher (parser), true};

                case first_object_state:
                    if (c == ']') {
                        this->end_array (parser);
                        break;
                    }
                    PSTORE_FALLTHROUGH;
                case object_state:
                    this->set_state (comma_state);
                    return {this->make_root_matcher (parser), false};
                    break;
                case comma_state:
                    if (isspace (c)) {
                        // just consume whitespace before a comma.
                        return {this->make_whitespace_matcher (parser), false};
                    }
                    switch (c) {
                    case ',':
                        this->set_state (
                            (parser.extension_enabled (extensions::array_trailing_comma))
                                ? first_object_state
                                : object_state);
                        return {this->make_whitespace_matcher (parser), true};
                    case ']': this->end_array (parser); break;
                    default: this->set_error (parser, error_code::expected_array_member); break;
                    }
                    break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                return {nullptr, true};
            }